

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O2

int __thiscall
CLayer::GetWireInOverFlowBoundary
          (CLayer *this,
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          *pWireList)

{
  int iVar1;
  CBoundary *this_00;
  pointer ppCVar2;
  int iVar3;
  int *piVar4;
  _Base_ptr p_Var5;
  pointer ppCVar6;
  bool bVar7;
  vector<CNet_*,_std::allocator<CNet_*>_> NetList;
  CWire *local_50;
  _Vector_base<CNet_*,_std::allocator<CNet_*>_> local_48;
  
  iVar1 = *(int *)&CObject::m_pDesign->field_0xc4c;
  p_Var5 = (this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header)
    {
      return (int)(pWireList->_M_ht)._M_num_elements;
    }
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = (CBoundary *)p_Var5[1]._M_parent;
    iVar3 = CBoundary::GetOverFlow(this_00);
    std::
    __sort<__gnu_cxx::__normal_iterator<CWire**,std::vector<CWire*,std::allocator<CWire*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CWireOpLen>>
              ((this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    iVar3 = iVar3 * iVar1;
    ppCVar2 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar6 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppCVar6 != ppCVar2; ppCVar6 = ppCVar6 + 1) {
      local_50 = *ppCVar6;
      piVar4 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::operator[](pWireList,(key_type *)&local_50);
      *piVar4 = *piVar4 + 1;
      bVar7 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar7) break;
    }
    std::_Vector_base<CNet_*,_std::allocator<CNet_*>_>::~_Vector_base(&local_48);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

int CLayer::GetWireInOverFlowBoundary(hash_map<ADDRESS,int>* pWireList)
{
	int	iReRouting_Step		=	GetDesign()->m_Param.m_iReRouting_Step;
	for(multimap<int, CBoundary*>::iterator itr=m_CBoundaryBucket.begin(),end=m_CBoundaryBucket.end();itr!=end;++itr)
	{
		vector<CNet*>	NetList;
		CBoundary*	pBoundary	=	itr->second;

		int	iNumOF	=	pBoundary->GetOverFlow()*iReRouting_Step;

		sort(pBoundary->m_Wire.begin(),pBoundary->m_Wire.end(),CWireOpLen());
		for(vector<CWire*>::iterator itrw=pBoundary->m_Wire.begin(),end=pBoundary->m_Wire.end();itrw!=end;++itrw)
		{
			++(*pWireList)[(ADDRESS)(*itrw)];
			if(iNumOF--==0)	break;
		}
	}

	return	pWireList->size();
}